

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

TokenTerminalDistance * __thiscall
trieste::wf::Wellformed::compute_minimum_distance_to_terminal
          (TokenTerminalDistance *__return_storage_ptr__,Wellformed *this,size_t max_distance)

{
  bool bVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  type *local_58;
  type *_;
  type *token;
  _Self local_40;
  const_iterator __end2;
  const_iterator __begin2;
  map<trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
  *__range2;
  size_t max_distance_local;
  Wellformed *this_local;
  TokenTerminalDistance *distance;
  
  CLI::std::
  map<trieste::Token,_unsigned_long,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
  ::map((map<trieste::Token,_unsigned_long,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
         *)__return_storage_ptr__);
  __end2._M_node =
       (_Base_ptr)
       std::
       map<trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
       ::begin((map<trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
                *)this);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
       ::end((map<trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>_>
              *)this);
  while (bVar1 = std::operator==((_Self *)&__end2,&local_40), ((bVar1 ^ 0xffU) & 1) != 0) {
    token = &std::
             _Rb_tree_const_iterator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>
                          *)&__end2)->first;
    _ = (type *)std::
                get<0ul,trieste::Token_const,std::variant<trieste::wf::Sequence,trieste::wf::Fields>>
                          ((pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>
                            *)token);
    local_58 = std::
               get<1ul,trieste::Token_const,std::variant<trieste::wf::Sequence,trieste::wf::Fields>>
                         ((pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>
                           *)token);
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::set
              ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
               &local_88);
    sVar2 = min_dist_to_terminal
                      (this,__return_storage_ptr__,
                       (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                        *)&local_88,max_distance,(Token *)_);
    pmVar3 = CLI::std::
             map<trieste::Token,_unsigned_long,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
             ::operator[]((map<trieste::Token,_unsigned_long,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_unsigned_long>_>_>
                           *)__return_storage_ptr__,(key_type *)_);
    *pmVar3 = sVar2;
    std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::~set
              ((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
               &local_88);
    std::
    _Rb_tree_const_iterator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_trieste::Token,_std::variant<trieste::wf::Sequence,_trieste::wf::Fields>_>_>
                  *)&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenTerminalDistance
      compute_minimum_distance_to_terminal(std::size_t max_distance) const
      {
        TokenTerminalDistance distance;

        for (auto& [token, _] : shapes)
        {
          distance[token] =
            min_dist_to_terminal(distance, {}, max_distance, token);
        }

        return distance;
      }